

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl.h
# Opt level: O3

Node * __thiscall
YAML::Node::operator[]<std::__cxx11::string>
          (Node *__return_storage_ptr__,Node *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  node *pnVar3;
  bool bVar4;
  shared_memory_holder local_50;
  string local_40;
  
  EnsureNodeExists(this);
  local_50.super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->m_pMemory).super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr;
  pnVar3 = this->m_pNode;
  local_50.super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (this->m_pMemory).
          super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi;
  if (local_50.super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_50.super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_50.super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_50.super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_50.super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  pnVar3 = detail::node::get<std::__cxx11::string>(pnVar3,key,&local_50);
  if (local_50.super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (pnVar3 == (node *)0x0) {
    streamable_to_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
    ::impl(&local_40,key);
    __return_storage_ptr__->m_isValid = false;
    (__return_storage_ptr__->m_invalidKey)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_invalidKey).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_invalidKey,local_40._M_dataplus._M_p,
               local_40._M_dataplus._M_p + local_40._M_string_length);
    (__return_storage_ptr__->m_pMemory).
    super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (__return_storage_ptr__->m_pMemory).
    super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    __return_storage_ptr__->m_pNode = (node *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p == &local_40.field_2) {
      return __return_storage_ptr__;
    }
    operator_delete(local_40._M_dataplus._M_p);
    return __return_storage_ptr__;
  }
  peVar2 = (this->m_pMemory).
           super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (this->m_pMemory).
            super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    __return_storage_ptr__->m_isValid = true;
    (__return_storage_ptr__->m_invalidKey)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_invalidKey).field_2;
    (__return_storage_ptr__->m_invalidKey)._M_string_length = 0;
    (__return_storage_ptr__->m_invalidKey).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->m_pMemory).
    super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
    (__return_storage_ptr__->m_pMemory).
    super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    __return_storage_ptr__->m_pNode = pnVar3;
    return __return_storage_ptr__;
  }
  paVar1 = &(__return_storage_ptr__->m_invalidKey).field_2;
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
    bVar4 = __libc_single_threaded == '\0';
    __return_storage_ptr__->m_isValid = true;
    (__return_storage_ptr__->m_invalidKey)._M_dataplus._M_p = (pointer)paVar1;
    (__return_storage_ptr__->m_invalidKey)._M_string_length = 0;
    (__return_storage_ptr__->m_invalidKey).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->m_pMemory).
    super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
    (__return_storage_ptr__->m_pMemory).
    super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         this_00;
    if (bVar4) {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
      goto LAB_00420f23;
    }
  }
  else {
    this_00->_M_use_count = this_00->_M_use_count + 1;
    __return_storage_ptr__->m_isValid = true;
    (__return_storage_ptr__->m_invalidKey)._M_dataplus._M_p = (pointer)paVar1;
    (__return_storage_ptr__->m_invalidKey)._M_string_length = 0;
    (__return_storage_ptr__->m_invalidKey).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->m_pMemory).
    super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
    (__return_storage_ptr__->m_pMemory).
    super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         this_00;
  }
  this_00->_M_use_count = this_00->_M_use_count + 1;
LAB_00420f23:
  __return_storage_ptr__->m_pNode = pnVar3;
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  return __return_storage_ptr__;
}

Assistant:

inline const Node Node::operator[](const Key& key) const {
  EnsureNodeExists();
  detail::node* value =
      static_cast<const detail::node&>(*m_pNode).get(key, m_pMemory);
  if (!value) {
    return Node(ZombieNode, key_to_string(key));
  }
  return Node(*value, m_pMemory);
}